

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O1

void __thiscall
ParsedH264TrackData::extractData(ParsedH264TrackData *this,AVPacket *pkt,uint8_t *buff,int size)

{
  byte bVar1;
  pointer pvVar2;
  int iVar3;
  uint32_t uVar4;
  pointer puVar5;
  uint8_t *puVar6;
  ulong uVar7;
  undefined4 *puVar8;
  pointer pvVar9;
  uint uVar10;
  uint32_t *cur32;
  uint32_t *puVar11;
  uint32_t *puVar12;
  uint8_t *puVar13;
  uint32_t *cur32_1;
  uint8_t *start;
  size_t sVar14;
  ostringstream ss;
  uint *local_1e8;
  undefined8 local_1e0;
  uint local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  uint *local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  ostringstream local_1a8 [376];
  
  if ((this->m_firstExtract == true) &&
     (iVar3 = (*(this->super_ParsedTrackPrivData)._vptr_ParsedTrackPrivData[5])
                        (this,buff,(ulong)(uint)size), (char)iVar3 != '\0')) {
    this->m_firstExtract = false;
  }
  puVar11 = (uint32_t *)(buff + size);
  if (this->m_firstExtract == true) {
    puVar5 = (pointer)0x0;
    for (pvVar9 = (this->m_spsPpsList).
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar9 != (this->m_spsPpsList).
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pvVar9 = pvVar9 + 1) {
      puVar5 = (pvVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish +
               (long)(puVar5 + (4 - (long)(pvVar9->
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          )._M_impl.super__Vector_impl_data._M_start));
    }
    size = size + (int)puVar5;
  }
  bVar1 = this->m_nalSize;
  uVar7 = (ulong)bVar1;
  iVar3 = 0;
  puVar12 = (uint32_t *)buff;
  if (buff <= (uint8_t *)((long)puVar11 - uVar7)) {
    iVar3 = 0;
    do {
      if ((char)uVar7 == '\x02') {
        uVar4 = (uint32_t)(ushort)((ushort)*puVar12 << 8 | (ushort)*puVar12 >> 8);
      }
      else if ((int)uVar7 == 3) {
        uVar4 = (uint)*(byte *)((long)puVar12 + 2) |
                (uint)*(byte *)((long)puVar12 + 1) << 8 | (uint)(byte)*puVar12 << 0x10;
      }
      else {
        if ((int)uVar7 != 4) {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Unsupported nal unit size ",0x1a);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          puVar8 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar8 = 3;
          *(undefined4 **)(puVar8 + 2) = puVar8 + 6;
          if (local_1c8 == &local_1b8) {
            puVar8[6] = local_1b8;
            puVar8[7] = uStack_1b4;
            puVar8[8] = uStack_1b0;
            puVar8[9] = uStack_1ac;
          }
          else {
            *(uint **)(puVar8 + 2) = local_1c8;
            *(ulong *)(puVar8 + 6) = CONCAT44(uStack_1b4,local_1b8);
          }
          *(undefined8 *)(puVar8 + 4) = local_1c0;
          local_1c0 = 0;
          local_1b8 = local_1b8 & 0xffffff00;
          local_1c8 = &local_1b8;
          __cxa_throw(puVar8,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        uVar4 = my_ntohl(*puVar12);
      }
      iVar3 = iVar3 + 1;
      bVar1 = this->m_nalSize;
      uVar7 = (ulong)bVar1;
      puVar12 = (uint32_t *)((long)puVar12 + (ulong)(uVar4 + bVar1));
    } while (puVar12 <= (uint32_t *)((long)puVar11 - uVar7));
  }
  if (puVar12 != puVar11) {
    __assert_fail("curPos == end",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/matroskaParser.cpp"
                  ,0x8d,
                  "virtual void ParsedH264TrackData::extractData(AVPacket *, uint8_t *, const int)")
    ;
  }
  iVar3 = (4 - (uint)bVar1) * iVar3 + size;
  puVar6 = (uint8_t *)operator_new__((long)iVar3);
  pkt->data = puVar6;
  pkt->size = iVar3;
  if (this->m_firstExtract == true) {
    pvVar2 = (this->m_spsPpsList).
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar13 = puVar6;
    for (pvVar9 = (this->m_spsPpsList).
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar9 != pvVar2; pvVar9 = pvVar9 + 1)
    {
      puVar13[0] = '\0';
      puVar13[1] = '\0';
      puVar13[2] = '\0';
      puVar13[3] = '\x01';
      puVar5 = (pvVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      memcpy(puVar13 + 4,puVar5,
             (long)(pvVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar5);
      puVar13 = puVar13 + (long)((pvVar9->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_finish +
                                (4 - (long)(pvVar9->
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           )._M_impl.super__Vector_impl_data._M_start));
    }
    puVar6 = puVar6 + ((int)puVar13 - (int)puVar6);
  }
  uVar7 = (ulong)this->m_nalSize;
  if (buff <= (uint8_t *)((long)puVar11 - uVar7)) {
    do {
      if ((char)uVar7 == '\x02') {
        sVar14 = (size_t)(ushort)((ushort)*(uint32_t *)buff << 8 | (ushort)*(uint32_t *)buff >> 8);
      }
      else if ((int)uVar7 == 3) {
        sVar14 = (size_t)((uint)*(byte *)((long)buff + 2) |
                         (uint)*(byte *)((long)buff + 1) << 8 |
                         (uint)(byte)*(uint32_t *)buff << 0x10);
      }
      else {
        if ((int)uVar7 != 4) {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Unsupported nal unit size ",0x1a);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          puVar8 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar8 = 3;
          *(undefined4 **)(puVar8 + 2) = puVar8 + 6;
          if (local_1e8 == &local_1d8) {
            puVar8[6] = local_1d8;
            puVar8[7] = uStack_1d4;
            puVar8[8] = uStack_1d0;
            puVar8[9] = uStack_1cc;
          }
          else {
            *(uint **)(puVar8 + 2) = local_1e8;
            *(ulong *)(puVar8 + 6) = CONCAT44(uStack_1d4,local_1d8);
          }
          *(undefined8 *)(puVar8 + 4) = local_1e0;
          local_1d8 = local_1d8 & 0xffffff00;
          __cxa_throw(puVar8,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        uVar4 = my_ntohl(*(uint32_t *)buff);
        sVar14 = (size_t)uVar4;
      }
      puVar6[0] = '\0';
      puVar6[1] = '\0';
      puVar6[2] = '\0';
      puVar6[3] = '\x01';
      if ((char)*(byte *)((long)buff + (ulong)this->m_nalSize) < '\0') {
        __assert_fail("(curPos[m_nalSize] & 0x80) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/matroskaParser.cpp"
                      ,0xab,
                      "virtual void ParsedH264TrackData::extractData(AVPacket *, uint8_t *, const int)"
                     );
      }
      uVar10 = (int)puVar11 - (int)buff;
      uVar7 = (ulong)uVar10;
      if ((uint)sVar14 < uVar10) {
        uVar7 = sVar14;
      }
      memcpy(puVar6 + 4,(byte *)((ulong)this->m_nalSize + (long)buff),uVar7);
      uVar7 = (ulong)this->m_nalSize;
      buff = (uint8_t *)((long)buff + (ulong)((uint)this->m_nalSize + (uint)sVar14));
      puVar6 = puVar6 + sVar14 + 4;
    } while (buff <= (uint32_t *)((long)puVar11 - uVar7));
  }
  this->m_firstExtract = false;
  return;
}

Assistant:

void ParsedH264TrackData::extractData(AVPacket* pkt, uint8_t* buff, const int size)
{
    int newBufSize = size;
    uint8_t* curPos = buff;
    const uint8_t* end = buff + size;
    int elements = 0;

    if (m_firstExtract && spsppsExists(buff, size))
        m_firstExtract = false;

    if (m_firstExtract)
        newBufSize += static_cast<int>(getSPSPPSLen());

    while (curPos <= end - m_nalSize)
    {
        uint32_t elSize = 0;
        if (m_nalSize == 4)
        {
            const auto cur32 = reinterpret_cast<uint32_t*>(curPos);
            elSize = my_ntohl(*cur32);
        }
        else if (m_nalSize == 3)
            elSize = (curPos[0] << 16l) + (curPos[1] << 8l) + curPos[2];
        else if (m_nalSize == 2)
            elSize = (curPos[0] << 8l) + curPos[1];
        else
            THROW(ERR_COMMON, "Unsupported nal unit size " << elSize)
        elements++;
        curPos += elSize + m_nalSize;
    }
    assert(curPos == end);
    if (curPos > end)
    {
        LTRACE(LT_ERROR, 2, "Matroska parse error: invalid H264 NAL unit size. NAL unit truncated.");
    }
    newBufSize += elements * (4 - m_nalSize);
    pkt->data = new uint8_t[newBufSize];
    pkt->size = newBufSize;

    uint8_t* dst = pkt->data;
    if (m_firstExtract)
    {
        dst += writeSPSPPS(dst);
    }
    curPos = buff;
    while (curPos <= end - m_nalSize)
    {
        uint32_t elSize = 0;
        if (m_nalSize == 4)
        {
            const auto cur32 = reinterpret_cast<uint32_t*>(curPos);
            elSize = my_ntohl(*cur32);
        }
        else if (m_nalSize == 3)
            elSize = (curPos[0] << 16l) + (curPos[1] << 8l) + curPos[2];
        else if (m_nalSize == 2)
            elSize = (curPos[0] << 8l) + curPos[1];
        else
            THROW(ERR_COMMON, "Unsupported nal unit size " << elSize)
        writeNalHeader(dst);
        assert((curPos[m_nalSize] & 0x80) == 0);
        memcpy(dst, curPos + m_nalSize, FFMIN(elSize, (uint32_t)(end - curPos)));
        curPos += elSize + m_nalSize;
        dst += elSize;
    }
    m_firstExtract = false;
}